

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

l_mem atomic(lua_State *L)

{
  global_State *g_00;
  GCObject *pGVar1;
  lu_mem lVar2;
  GCObject *f;
  lu_mem lVar3;
  GCObject *grayagain;
  GCObject *origall;
  GCObject *origweak;
  l_mem work;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  pGVar1 = g_00->grayagain;
  g_00->gcstate = '\b';
  g_00->GCmemtrav = 0;
  if ((L->marked & 3) != 0) {
    reallymarkobject(g_00,(GCObject *)L);
  }
  if ((((g_00->l_registry).tt_ & 0x40U) != 0) && ((((g_00->l_registry).value_.gc)->marked & 3) != 0)
     ) {
    reallymarkobject(g_00,(g_00->l_registry).value_.gc);
  }
  markmt(g_00);
  remarkupvals(g_00);
  propagateall(g_00);
  lVar2 = g_00->GCmemtrav;
  g_00->gray = pGVar1;
  propagateall(g_00);
  g_00->GCmemtrav = 0;
  convergeephemerons(g_00);
  clearvalues(g_00,g_00->weak,(GCObject *)0x0);
  clearvalues(g_00,g_00->allweak,(GCObject *)0x0);
  pGVar1 = g_00->weak;
  f = g_00->allweak;
  lVar3 = g_00->GCmemtrav;
  separatetobefnz(g_00,0);
  g_00->gcfinnum = 1;
  markbeingfnz(g_00);
  propagateall(g_00);
  g_00->GCmemtrav = 0;
  convergeephemerons(g_00);
  clearkeys(g_00,g_00->ephemeron,(GCObject *)0x0);
  clearkeys(g_00,g_00->allweak,(GCObject *)0x0);
  clearvalues(g_00,g_00->weak,pGVar1);
  clearvalues(g_00,g_00->allweak,f);
  luaS_clearcache(g_00);
  g_00->currentwhite = g_00->currentwhite ^ 3;
  return g_00->GCmemtrav + lVar3 + lVar2;
}

Assistant:

static l_mem atomic(lua_State *L) {
    global_State *g = G(L);
    l_mem work;
    GCObject *origweak, *origall;
    GCObject *grayagain = g->grayagain;  /* save original list */
    lua_assert(g->ephemeron == NULL && g->weak == NULL);
    lua_assert(!iswhite(g->mainthread));
    g->gcstate = GCSinsideatomic;
    g->GCmemtrav = 0;  /* start counting work */
    markobject(g, L);  /* mark running thread */
    /* registry and global metatables may be changed by API */
    markvalue(g, &g->l_registry);
    markmt(g);  /* mark global metatables */
    /* remark occasional upvalues of (maybe) dead threads */
    remarkupvals(g);
    propagateall(g);  /* propagate changes */
    work = g->GCmemtrav;  /* stop counting (do not recount 'grayagain') */
    g->gray = grayagain;
    propagateall(g);  /* traverse 'grayagain' list */
    g->GCmemtrav = 0;  /* restart counting */
    convergeephemerons(g);
    /* at this point, all strongly accessible objects are marked. */
    /* Clear values from weak tables, before checking finalizers */
    clearvalues(g, g->weak, NULL);
    clearvalues(g, g->allweak, NULL);
    origweak = g->weak;
    origall = g->allweak;
    work += g->GCmemtrav;  /* stop counting (objects being finalized) */
    separatetobefnz(g, 0);  /* separate objects to be finalized */
    g->gcfinnum = 1;  /* there may be objects to be finalized */
    markbeingfnz(g);  /* mark objects that will be finalized */
    propagateall(g);  /* remark, to propagate 'resurrection' */
    g->GCmemtrav = 0;  /* restart counting */
    convergeephemerons(g);
    /* at this point, all resurrected objects are marked. */
    /* remove dead objects from weak tables */
    clearkeys(g, g->ephemeron, NULL);  /* clear keys from all ephemeron tables */
    clearkeys(g, g->allweak, NULL);  /* clear keys from all 'allweak' tables */
    /* clear values from resurrected weak tables */
    clearvalues(g, g->weak, origweak);
    clearvalues(g, g->allweak, origall);
    luaS_clearcache(g);
    g->currentwhite = cast_byte(otherwhite(g));  /* flip current white */
    work += g->GCmemtrav;  /* complete counting */
    return work;  /* estimate of memory marked by 'atomic' */
}